

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

SUNErrCode
SUNClassicalGS(N_Vector *v,sunrealtype **h,int k,int p,sunrealtype *new_vk_norm,sunrealtype *stemp,
              N_Vector *vtemp)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  sunrealtype sVar5;
  double dVar6;
  sunrealtype sVar7;
  double dVar8;
  
  uVar1 = k - p;
  if (k < p) {
    p = k;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  N_VDotProdMulti(p + 1U,v[k],v + uVar2,stemp);
  dVar6 = stemp[p];
  dVar8 = 0.0;
  if (0.0 < dVar6) {
    if (dVar6 < 0.0) {
      dVar8 = sqrt(dVar6);
    }
    else {
      dVar8 = SQRT(dVar6);
    }
  }
  iVar4 = k + -1;
  if (0 < p) {
    lVar3 = (ulong)(uint)p + 1;
    do {
      h[lVar3 + -2][iVar4] = stemp[lVar3 + -2];
      stemp[lVar3 + -1] = -stemp[lVar3 + -2];
      vtemp[lVar3 + -1] = v[lVar3 + -2];
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  *stemp = 1.0;
  *vtemp = v[k];
  N_VLinearCombination(p + 1U,stemp,vtemp,v[k]);
  sVar5 = N_VDotProd(v[k],v[k]);
  dVar6 = 0.0;
  if (0.0 < sVar5) {
    sVar5 = N_VDotProd(v[k],v[k]);
    if (sVar5 < 0.0) {
      dVar6 = sqrt(sVar5);
    }
    else {
      dVar6 = SQRT(sVar5);
    }
  }
  *new_vk_norm = dVar6;
  if (dVar6 * 1000.0 < dVar8) {
    N_VDotProdMulti(p,v[k],v + uVar2,stemp + 1);
    *stemp = 1.0;
    *vtemp = v[k];
    if ((int)uVar2 < k) {
      lVar3 = 0;
      do {
        h[uVar2 + lVar3][iVar4] = stemp[lVar3 + 1] + h[uVar2 + lVar3][iVar4];
        stemp[lVar3 + 1] = -stemp[lVar3 + 1];
        vtemp[lVar3 + 1] = v[lVar3];
        lVar3 = lVar3 + 1;
      } while ((uint)k - uVar2 != lVar3);
    }
    N_VLinearCombination(k + 1,stemp,vtemp,v[k]);
    sVar5 = N_VDotProd(v[k],v[k]);
    sVar7 = 0.0;
    if (0.0 < sVar5) {
      sVar7 = N_VDotProd(v[k],v[k]);
      if (sVar7 < 0.0) {
        sVar7 = sqrt(sVar7);
      }
      else {
        sVar7 = SQRT(sVar7);
      }
    }
    *new_vk_norm = sVar7;
  }
  return 0;
}

Assistant:

SUNErrCode SUNClassicalGS(N_Vector* v, sunrealtype** h, int k, int p,
                          sunrealtype* new_vk_norm, sunrealtype* stemp,
                          N_Vector* vtemp)
{
  SUNFunctionBegin(v[0]->sunctx);
  int i, i0, k_minus_1;
  sunrealtype vk_norm;

  k_minus_1 = k - 1;
  i0        = SUNMAX(k - p, 0);

  /* Perform Classical Gram-Schmidt */

  SUNCheckCall(N_VDotProdMulti(k - i0 + 1, v[k], v + i0, stemp));

  vk_norm = SUNRsqrt(stemp[k - i0]);
  for (i = k - i0 - 1; i >= 0; i--)
  {
    h[i][k_minus_1] = stemp[i];
    stemp[i + 1]    = -stemp[i];
    vtemp[i + 1]    = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  SUNCheckCall(N_VLinearCombination(k - i0 + 1, stemp, vtemp, v[k]));

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
  SUNCheckLastErr();

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm)
  {
    SUNCheckCall(N_VDotProdMulti(k - i0, v[k], v + i0, stemp + 1));

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i = i0; i < k; i++)
    {
      h[i][k_minus_1] += stemp[i - i0 + 1];
      stemp[i - i0 + 1] = -stemp[i - i0 + 1];
      vtemp[i - i0 + 1] = v[i - i0];
    }

    SUNCheckCall(N_VLinearCombination(k + 1, stemp, vtemp, v[k]));

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
    SUNCheckLastErr();
  }

  return SUN_SUCCESS;
}